

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device_ping.cpp
# Opt level: O1

bool __thiscall dev_ping::Impl::getsockaddr(Impl *this,char *host,sockaddr_in *sockaddr)

{
  char cVar1;
  in_addr_t iVar2;
  char *pcVar3;
  hostent *phVar4;
  
  sockaddr->sin_family = 0;
  sockaddr->sin_port = 0;
  sockaddr->sin_addr = 0;
  sockaddr->sin_family = 2;
  if ((host == (char *)0x0) || (pcVar3 = host, *host == '\0')) {
    (sockaddr->sin_addr).s_addr = 0;
  }
  else {
    do {
      cVar1 = *pcVar3;
      if (cVar1 == '\0') {
        iVar2 = inet_addr(host);
        goto LAB_00103f10;
      }
      pcVar3 = pcVar3 + 1;
    } while ((byte)(cVar1 - 0x30U) < 10 || cVar1 == '.');
    phVar4 = gethostbyname(host);
    if (phVar4 == (hostent *)0x0) {
      return phVar4 != (hostent *)0x0;
    }
    iVar2 = *(in_addr_t *)*phVar4->h_addr_list;
LAB_00103f10:
    (sockaddr->sin_addr).s_addr = iVar2;
  }
  return true;
}

Assistant:

bool dev_ping::Impl::getsockaddr(const char *host, sockaddr_in *sockaddr)
{
    memset(static_cast<void *>(sockaddr), 0, sizeof(sockaddr));
    sockaddr->sin_family = AF_INET;

    bool rc = true;
    if (host == NULL || host[0] == '\0') {
        sockaddr->sin_addr.s_addr = htonl(INADDR_ANY);
    }
    else {
        char c;
        const char *p = host;
        bool is_ipaddr = true;
        while ((c = (*p++)) != '\0') {
            if ((c != '.') && (!((c >= '0') && (c <= '9')))) {
                is_ipaddr = false;
                break;
            }
        }

        if (is_ipaddr) {
            sockaddr->sin_addr.s_addr = inet_addr(host);
        }
        else {
            struct hostent *hostname = gethostbyname(host);
            if (hostname != NULL) {
                memcpy(&(sockaddr->sin_addr), *(hostname->h_addr_list), sizeof(struct in_addr));
            }
            else {
                rc = false;
            }
        }
    }
    return rc;
}